

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::DFARoutineEM64T<char>::emit
               (X86Assembler *as,Label *rejectlabel,DFA<char> *dfa,MyConstPool *pool)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label finishlabel;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_68;
  anon_union_16_7_ed616b9d_for_Operand__0 local_50;
  Operand_ *local_40;
  MyConstPool *local_38;
  
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (Label *)0x0;
  local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
  local_38 = pool;
  if (0 < (int)((ulong)((long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                              super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                             super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    iVar3 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_50,as);
      if (local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Label *)&local_50._any);
      }
      else {
        ((local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0] =
             local_50._packed[0];
        ((local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.field_2 =
             local_50._mem.field_2;
        local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar3 = iVar3 + 1;
      iVar1 = (int)((ulong)((long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                                  super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                                 super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar3,iVar1 * 0x38e38e39) != iVar3 + iVar1 * -0x38e38e39 < 0);
  }
  local_40 = (Operand_ *)rejectlabel;
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_50,as);
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,(Operand_ *)(::asmjit::x86OpData + 0x4b0),0);
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x11e,
             (Operand_ *)
             local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                              super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                             super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    lVar5 = 0;
    lVar4 = 0;
    lVar2 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
                (as,(long)&(local_68.
                            super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_Operand + lVar4);
      emit_state(as,(Label *)&local_50._any,
                 (DFAState<char> *)
                 ((long)&(((dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                           super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_NFABaseState<char,_Centaurus::IndexVector>)._vptr_NFABaseState +
                 lVar5),(int)lVar2,&local_68,local_38);
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 0x10;
      lVar5 = lVar5 + 0x48;
    } while (lVar2 < (int)((ulong)((long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                                         super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(dfa->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                                        super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_50);
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(::asmjit::x86OpData + 0x4e0),
             (Operand_ *)(::asmjit::x86OpData + 0x4b0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,(Operand_ *)(::asmjit::x86OpData + 0x4e0),0);
  ::asmjit::CodeEmitter::emit((CodeEmitter *)as,0x132,local_40);
  if ((Operand_ *)
      local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start != (Operand_ *)0x0) {
    operator_delete(local_68.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFA<TCHAR>& dfa, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    asmjit::Label finishlabel = as.newLabel();

    as.mov(BACKUP_REG, 0);
    as.jmp(statelabels[0]);

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);

        emit_state(as, finishlabel, dfa[i], i, statelabels, pool);
    }
    as.bind(finishlabel);
    as.mov(INPUT_REG, BACKUP_REG);
    as.cmp(INPUT_REG, 0);
    as.jz(rejectlabel);
}